

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O0

void resolv_worker(void *index)

{
  int iVar1;
  nng_err result;
  nni_aio *pnVar2;
  int *piVar3;
  void *pvVar4;
  nni_aio **local_198;
  char *local_188;
  nni_resolv_item *item;
  nni_aio *aio;
  char host [256];
  char serv [8];
  int rv;
  addrinfo *probe;
  addrinfo *results;
  addrinfo hints;
  int tid;
  void *index_local;
  
  hints.ai_next._4_4_ = (int)index;
  nni_thr_set_name((nni_thr *)0x0,"nng:resolver");
  nni_mtx_lock(&resolv_mtx);
  do {
    while( true ) {
      while (pnVar2 = (nni_aio *)nni_list_first(&resolv_aios), pnVar2 == (nni_aio *)0x0) {
        if ((resolv_fini & 1U) != 0) {
          nni_mtx_unlock(&resolv_mtx);
          return;
        }
        nni_cv_wait(&resolv_cv);
      }
      piVar3 = (int *)nni_aio_get_prov_data(pnVar2);
      nni_aio_list_remove(pnVar2);
      resolv_active[hints.ai_next._4_4_] = pnVar2;
      if (*(long *)(piVar3 + 2) == 0) {
        local_188 = "";
      }
      else {
        local_188 = *(char **)(piVar3 + 2);
      }
      snprintf((char *)&aio,0x100,"%s",local_188);
      snprintf(host + 0xfc,8,"%u",(ulong)*(ushort *)(piVar3 + 4));
      hints.ai_addr = (sockaddr *)0x0;
      hints.ai_canonname = (char *)0x0;
      hints.ai_socktype = 0;
      hints.ai_protocol = 0;
      hints.ai_addrlen = 0;
      hints._20_4_ = 0;
      results = (addrinfo *)0x0;
      hints.ai_flags = 0;
      hints.ai_family = 0;
      probe = (addrinfo *)0x0;
      iVar1 = *piVar3;
      if (iVar1 != 0) break;
      results._4_4_ = 0;
LAB_001217a3:
      results._0_4_ = 0x20;
      if ((*(byte *)(piVar3 + 1) & 1) != 0) {
        results._0_4_ = 0x21;
      }
      hints.ai_flags = 1;
      hints.ai_family = 0;
      results = (addrinfo *)(CONCAT44(results._4_4_,results._0_4_) | 0x400);
      nni_mtx_unlock(&resolv_mtx);
      if ((char)aio == '\0') {
        local_198 = (nni_aio **)0x0;
      }
      else {
        local_198 = &aio;
      }
      iVar1 = getaddrinfo((char *)local_198,host + 0xfc,(addrinfo *)&results,(addrinfo **)&probe);
      nni_mtx_lock(&resolv_mtx);
      pnVar2 = resolv_active[hints.ai_next._4_4_];
      if (pnVar2 == (nni_aio *)0x0) {
        if (iVar1 == 0) {
          freeaddrinfo((addrinfo *)probe);
        }
      }
      else {
        resolv_active[hints.ai_next._4_4_] = (nni_aio *)0x0;
        if (iVar1 == 0) {
          stack0xffffffffffffffa8 = probe;
          while (((stack0xffffffffffffffa8 != (addrinfo *)0x0 &&
                  (stack0xffffffffffffffa8->ai_addr->sa_family != 2)) &&
                 (stack0xffffffffffffffa8->ai_addr->sa_family != 10))) {
            unique0x00012000 = stack0xffffffffffffffa8->ai_next;
          }
          if (stack0xffffffffffffffa8 == (addrinfo *)0x0) {
            nni_aio_finish_error(pnVar2,NNG_EADDRINVAL);
            freeaddrinfo((addrinfo *)probe);
          }
          else {
            pvVar4 = nni_aio_get_prov_data(pnVar2);
            nni_aio_set_prov_data(pnVar2,(void *)0x0);
            if (pvVar4 == (void *)0x0) {
              nni_panic("%s: %d: assert err: %s",
                        "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_resolv_gai.c"
                        ,0x115,"item != NULL");
            }
            nni_posix_sockaddr2nn
                      (*(nni_sockaddr **)((long)pvVar4 + 0x18),stack0xffffffffffffffa8->ai_addr,
                       (ulong)stack0xffffffffffffffa8->ai_addrlen);
            freeaddrinfo((addrinfo *)probe);
            nni_aio_finish(pnVar2,NNG_OK,0);
          }
        }
        else {
          result = posix_gai_errno(iVar1);
          nni_aio_finish_error(pnVar2,result);
        }
      }
    }
    if (iVar1 == 3) {
      results._4_4_ = 2;
      goto LAB_001217a3;
    }
    if (iVar1 == 4) {
      results._4_4_ = 10;
      goto LAB_001217a3;
    }
    resolv_active[hints.ai_next._4_4_] = (nni_aio *)0x0;
    nni_aio_finish_error(pnVar2,NNG_ENOTSUP);
  } while( true );
}

Assistant:

void
resolv_worker(void *index)
{
	int              tid = (int) (intptr_t) index;
	struct addrinfo  hints;
	struct addrinfo *results;
	struct addrinfo *probe;
	int              rv;
	char             serv[8];
	char             host[256];
	nni_aio         *aio;
	nni_resolv_item *item;

	nni_thr_set_name(NULL, "nng:resolver");

	nni_mtx_lock(&resolv_mtx);
	for (;;) {

		if ((aio = nni_list_first(&resolv_aios)) == NULL) {
			if (resolv_fini) {
				break;
			}
			nni_cv_wait(&resolv_cv);
			continue;
		}

		item = nni_aio_get_prov_data(aio);
		nni_aio_list_remove(aio);
		resolv_active[tid] = aio;

		snprintf(host, sizeof(host), "%s",
		    item->ri_host ? item->ri_host : "");
		snprintf(serv, sizeof(serv), "%u", item->ri_port);

		// We treat these all as IP addresses.  The service and the
		// host part are split.
		memset(&hints, 0, sizeof(hints));

		results = NULL;

		switch (item->ri_family) {
		case NNG_AF_INET:
			hints.ai_family = AF_INET;
			break;

#ifdef NNG_ENABLE_IPV6
		case NNG_AF_INET6:
			hints.ai_family = AF_INET6;
			break;
		case NNG_AF_UNSPEC:
			hints.ai_family = AF_UNSPEC;
			break;
#else
		case NNG_AF_UNSPEC:
			hints.ai_family = AF_INET;
			break;
#endif
		default:
			resolv_active[tid] = NULL;
			nni_aio_finish_error(aio, NNG_ENOTSUP);
			continue;
		}

#ifdef AI_ADDRCONFIG
		hints.ai_flags = AI_ADDRCONFIG;
#endif
		if (item->ri_passive) {
			hints.ai_flags |= AI_PASSIVE;
		}
		hints.ai_socktype = SOCK_STREAM;
		hints.ai_flags |= AI_NUMERICSERV;

		// We can pass any non-zero service number, but we have to pass
		// *something*, in case we are using a NULL hostname.  The lock
		// is dropped to allow other submissions, and other threads to
		// process.
		nni_mtx_unlock(&resolv_mtx);
		rv = getaddrinfo(
		    host[0] != 0 ? host : NULL, serv, &hints, &results);
		nni_mtx_lock(&resolv_mtx);

		if ((aio = resolv_active[tid]) == NULL) {
			// no more interest (canceled), so ignore the result
			// and carry on
			if (rv == 0) {
				freeaddrinfo(results);
			}
			continue;
		}
		resolv_active[tid] = NULL;

		if (rv != 0) {
			rv = posix_gai_errno(rv);
			nni_aio_finish_error(aio, rv);
			continue;
		}

		// We only take the first matching address.  Presumably
		// DNS load balancing is done by the resolver/server.

		for (probe = results; probe != NULL; probe = probe->ai_next) {
			if (probe->ai_addr->sa_family == AF_INET) {
				break;
			}
#ifdef NNG_ENABLE_IPV6
			if (probe->ai_addr->sa_family == AF_INET6) {
				break;
			}
#endif
		}

		if (probe == NULL) {
			// no match
			nni_aio_finish_error(aio, NNG_EADDRINVAL);
			freeaddrinfo(results);
			continue;
		}

		item = nni_aio_get_prov_data(aio);
		nni_aio_set_prov_data(aio, NULL);
		NNI_ASSERT(item != NULL);

		(void) nni_posix_sockaddr2nn(
		    item->ri_sa, probe->ai_addr, probe->ai_addrlen);

		freeaddrinfo(results);
		nni_aio_finish(aio, 0, 0);
	}
	nni_mtx_unlock(&resolv_mtx);
}